

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O2

void __thiscall icu_63::RBBIRuleBuilder::optimizeTables(RBBIRuleBuilder *this)

{
  bool bVar1;
  int32_t iVar2;
  bool bVar3;
  IntPair duplPair;
  IntPair local_28;
  
  do {
    local_28.first = 3;
    local_28.second = 0;
    bVar3 = false;
    while( true ) {
      bVar1 = RBBITableBuilder::findDuplCharClassFrom(this->fForwardTable,&local_28);
      if (!bVar1) break;
      RBBISetBuilder::mergeCategories(this->fSetBuilder,local_28);
      RBBITableBuilder::removeColumn(this->fForwardTable,local_28.second);
      bVar3 = true;
    }
    do {
      bVar1 = bVar3;
      iVar2 = RBBITableBuilder::removeDuplicateStates(this->fForwardTable);
      bVar3 = true;
    } while (0 < iVar2);
  } while (bVar1);
  return;
}

Assistant:

void RBBIRuleBuilder::optimizeTables() {
    bool didSomething;
    do {
        didSomething = false;

        // Begin looking for duplicates with char class 3.
        // Classes 0, 1 and 2 are special; they are unused, {bof} and {eof} respectively,
        // and should not have other categories merged into them.
        IntPair duplPair = {3, 0};
        while (fForwardTable->findDuplCharClassFrom(&duplPair)) {
            fSetBuilder->mergeCategories(duplPair);
            fForwardTable->removeColumn(duplPair.second);
            didSomething = true;
        }

        while (fForwardTable->removeDuplicateStates() > 0) {
            didSomething = true;
        }
    } while (didSomething);
}